

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat_solver.cpp
# Opt level: O0

bool __thiscall Satyricon::SATSolver::simplify_clause(SATSolver *this,ClausePtr c)

{
  literal_value lVar1;
  Iterator pLVar2;
  Literal *pLVar3;
  Literal *l;
  Iterator __end1;
  Iterator __begin1;
  Clause *__range1;
  size_t j;
  ClausePtr c_local;
  SATSolver *this_local;
  
  __range1 = (Clause *)0x0;
  __end1 = Clause::begin(c);
  pLVar2 = Clause::end(c);
  while( true ) {
    if (__end1 == pLVar2) {
      Clause::shrink(c,(size_t)__range1);
      return false;
    }
    lVar1 = get_asigned_value(this,__end1);
    if (lVar1 == LIT_TRUE) break;
    lVar1 = get_asigned_value(this,__end1);
    if (lVar1 == LIT_UNASIGNED) {
      pLVar3 = Clause::at(c,(size_t)__range1);
      pLVar3->value = __end1->value;
      __range1 = (Clause *)&__range1->field_0x1;
    }
    __end1 = __end1 + 1;
  }
  return true;
}

Assistant:

bool SATSolver::simplify_clause( ClausePtr c ) {
    size_t j = 0;
    for ( const auto & l : *c ) {
        if ( get_asigned_value(l) == LIT_TRUE )
            return true; // useless
        if ( get_asigned_value(l) == LIT_UNASIGNED )
            c->at(j++) = l;
    }
    c->shrink(j);
    return false; // still usefull
}